

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<char>::format_output
          (basic_format<char> *this,stream_type *out,string_type *sformat)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  formattible<char> *in_RSI;
  format_parser *in_RDI;
  uint position;
  char_type c_1;
  char_type c;
  bool use_svalue;
  string_type value;
  string svalue;
  string key;
  format_guard guard;
  format_parser fmt;
  char *format;
  size_t size;
  size_t pos;
  char_type quote;
  char_type comma;
  char_type eq;
  char_type cbrk;
  char_type obrk;
  formattible<char> *fmt_00;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  format_parser *this_00;
  basic_format<char> *in_stack_ffffffffffffff18;
  int local_d0;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  format_guard local_58;
  format_parser local_48 [16];
  long local_38;
  ulong local_30;
  ulong local_28;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  formattible<char> *local_10;
  
  local_19 = '{';
  local_1a = '}';
  local_1b = '=';
  local_1c = ',';
  local_1d = '\'';
  local_28 = 0;
  local_10 = in_RSI;
  local_30 = std::__cxx11::string::size();
  local_38 = std::__cxx11::string::c_str();
  do {
    while( true ) {
      while( true ) {
        if (*(char *)(local_38 + local_28) == '\0') {
          return;
        }
        if (*(char *)(local_38 + local_28) == local_19) break;
        if ((*(char *)(local_38 + local_28) == local_1a) &&
           (*(char *)(local_38 + 1 + local_28) == local_1a)) {
          std::operator<<((ostream *)local_10,local_1a);
          local_28 = local_28 + 2;
        }
        else {
          std::operator<<((ostream *)local_10,*(char *)(local_38 + local_28));
          local_28 = local_28 + 1;
        }
      }
      if ((local_30 <= local_28 + 1) || (*(char *)(local_38 + 1 + local_28) != local_19)) break;
      std::operator<<((ostream *)local_10,local_19);
      local_28 = local_28 + 2;
    }
    local_28 = local_28 + 1;
    this_00 = local_48;
    booster::locale::details::format_parser::format_parser
              (this_00,(ios_base *)
                       ((long)&local_10->pointer_ + *(long *)((long)local_10->pointer_ + -0x18)),
               local_10,imbue_locale);
    format_guard::format_guard(&local_58,this_00);
    do {
      if (local_30 <= local_28) break;
      std::__cxx11::string::string(local_88);
      std::__cxx11::string::string(local_a8);
      std::__cxx11::string::string(local_c8);
      bVar2 = true;
      for (; (((*(char *)(local_38 + local_28) != '\0' &&
               (cVar1 = *(char *)(local_38 + local_28), cVar1 != local_1c)) && (cVar1 != local_1b))
             && (cVar1 != local_1a)); local_28 = local_28 + 1) {
        std::__cxx11::string::operator+=(local_88,cVar1);
      }
      if (*(char *)(local_38 + local_28) == local_1b) {
        uVar4 = local_28 + 1;
        if (*(char *)(local_38 + local_28 + 1) == local_1d) {
          local_28 = local_28 + 2;
          bVar2 = false;
          while (*(char *)(local_38 + local_28) != '\0') {
            if (*(char *)(local_38 + local_28) == local_1d) {
              if (*(char *)(local_38 + 1 + local_28) != local_1d) {
                local_28 = local_28 + 1;
                break;
              }
              std::__cxx11::string::operator+=(local_c8,local_1d);
              local_28 = local_28 + 2;
            }
            else {
              std::__cxx11::string::operator+=(local_c8,*(char *)(local_38 + local_28));
              local_28 = local_28 + 1;
            }
          }
        }
        else {
          while( true ) {
            local_28 = uVar4;
            cVar1 = *(char *)(local_38 + local_28);
            uVar3 = in_stack_ffffffffffffff04 & 0xffffff;
            if ((cVar1 != '\0') && (uVar3 = in_stack_ffffffffffffff04 & 0xffffff, cVar1 != local_1c)
               ) {
              uVar3 = CONCAT13(cVar1 != local_1a,(int3)in_stack_ffffffffffffff04);
            }
            in_stack_ffffffffffffff04 = uVar3;
            if ((char)(in_stack_ffffffffffffff04 >> 0x18) == '\0') break;
            std::__cxx11::string::operator+=(local_a8,cVar1);
            uVar4 = local_28 + 1;
          }
        }
      }
      if (bVar2) {
        booster::locale::details::format_parser::set_one_flag((string *)local_48,local_88);
      }
      else {
        details::format_parser::set_flag_with_str<char>
                  (in_RDI,(string *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      if (*(char *)(local_38 + local_28) == local_1c) {
        local_28 = local_28 + 1;
        local_d0 = 4;
      }
      else if (*(char *)(local_38 + local_28) == local_1a) {
        in_stack_ffffffffffffff00 = booster::locale::details::format_parser::get_position();
        fmt_00 = local_10;
        get(in_stack_ffffffffffffff18,(uint)((ulong)in_RDI >> 0x20));
        details::operator<<((stream_type *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),fmt_00);
        format_guard::restore
                  ((format_guard *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        local_28 = local_28 + 1;
        local_d0 = 5;
      }
      else {
        format_guard::restore
                  ((format_guard *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        local_d0 = 5;
      }
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_88);
    } while (local_d0 == 4);
    format_guard::~format_guard
              ((format_guard *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    booster::locale::details::format_parser::~format_parser(local_48);
  } while( true );
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }